

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall t_xml_generator::generate_program(t_xml_generator *this)

{
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  (*(this->super_t_generator)._vptr_t_generator[0xf])();
  std::__cxx11::string::string((string *)&local_50,"idl",&local_d2);
  write_element_start(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->should_use_namespaces_ == true) {
    if (this->should_use_default_ns_ == true) {
      std::__cxx11::string::string((string *)&local_70,"xmlns",&local_d2);
      std::__cxx11::string::string((string *)&local_90,"http://thrift.apache.org/xml/idl",&local_d1)
      ;
      write_attribute(this,&local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::string((string *)&local_b0,"xmlns:idl",&local_d2);
    std::__cxx11::string::string((string *)&local_d0,"http://thrift.apache.org/xml/idl",&local_d1);
    write_attribute(this,&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1f])(&local_30,this);
  write_xml_comment(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iterate_program(this,(this->super_t_generator).program_);
  write_element_end(this);
  (*(this->super_t_generator)._vptr_t_generator[0x10])(this);
  return;
}

Assistant:

void t_xml_generator::generate_program() {

  init_generator();

  write_element_start("idl");
  if (should_use_namespaces_) {
    if (should_use_default_ns_) {
      write_attribute("xmlns", "http://thrift.apache.org/xml/idl");
    }
    write_attribute("xmlns:idl", "http://thrift.apache.org/xml/idl");
  }

  write_xml_comment( xml_autogen_comment());

  iterate_program(program_);

  write_element_end();

  close_generator();

}